

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_format.c
# Opt level: O2

cesl_format_t * cesl_format_create(cesl_format_t *self,size_t buf_max_size,char *format_buffer)

{
  self->buf_max_size = buf_max_size;
  self->cur_pos = 0;
  self->error_code = 0;
  self->buf = format_buffer;
  *format_buffer = '\0';
  self->buf[buf_max_size - 1] = '\0';
  self->rst = cesl_format_rst;
  self->dbg = cesl_format_dbg;
  self->print = cesl_format_print;
  self->s = cesl_format_s;
  self->i64 = cesl_format_i64;
  self->i32 = cesl_format_i32;
  self->l = cesl_format_l;
  self->i = cesl_format_i;
  self->ui64 = cesl_format_ui64;
  self->ui32 = cesl_format_ui32;
  self->ul = cesl_format_ul;
  self->ui = cesl_format_ui;
  return self;
}

Assistant:

cesl_format_t* cesl_format_create(cesl_format_t* self, size_t buf_max_size, char* format_buffer)
{
    self->buf_max_size = buf_max_size;
    self->cur_pos = 0;
    self->error_code = 0;
    self->buf = format_buffer;
    self->buf[0] = '\0';
    self->buf[buf_max_size-1] = '\0';

    // Assign "member" functions
    self->rst = cesl_format_rst;
    self->dbg = cesl_format_dbg;
    self->print = cesl_format_print;
    self->s = cesl_format_s;
    self->i64 = cesl_format_i64;
    self->i32 = cesl_format_i32;
    self->l = cesl_format_l;
    self->i = cesl_format_i;
    self->ui64 = cesl_format_ui64;
    self->ui32 = cesl_format_ui32;
    self->ul = cesl_format_ul;
    self->ui = cesl_format_ui;
    return self;
}